

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_utilities.hpp
# Opt level: O2

size_t jsoncons::jsonpath::escape_string<wchar_t,std::__cxx11::wstring>
                 (wchar_t *s,size_t length,
                 basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *sink)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  
  lVar2 = 0;
  sVar3 = 0;
  do {
    if (length << 2 == lVar2) {
      return sVar3;
    }
    iVar1 = *(int *)((long)s + lVar2);
    lVar4 = 1;
    switch(iVar1) {
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    case 0xb:
      goto switchD_0035c2b7_caseD_b;
    case 0xc:
      break;
    case 0xd:
      break;
    default:
      if ((iVar1 == 0x27) || (lVar4 = 1, iVar1 == 0x5c)) break;
      goto switchD_0035c2b7_caseD_b;
    }
    std::__cxx11::wstring::push_back((wchar_t)sink);
    lVar4 = 2;
switchD_0035c2b7_caseD_b:
    std::__cxx11::wstring::push_back((wchar_t)sink);
    sVar3 = sVar3 + lVar4;
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

std::size_t escape_string(const CharT* s, std::size_t length, Sink& sink)
    {
        std::size_t count = 0;
        const CharT* begin = s;
        const CharT* end = s + length;
        for (const CharT* it = begin; it != end; ++it)
        {
            CharT c = *it;
            switch (c)
            {
                case '\\':
                    sink.push_back('\\');
                    sink.push_back('\\');
                    count += 2;
                    break;
                case '\'':
                    sink.push_back('\\');
                    sink.push_back('\'');
                    count += 2;
                    break;
                case '\b':
                    sink.push_back('\\');
                    sink.push_back('b');
                    count += 2;
                    break;
                case '\f':
                    sink.push_back('\\');
                    sink.push_back('f');
                    count += 2;
                    break;
                case '\n':
                    sink.push_back('\\');
                    sink.push_back('n');
                    count += 2;
                    break;
                case '\r':
                    sink.push_back('\\');
                    sink.push_back('r');
                    count += 2;
                    break;
                case '\t':
                    sink.push_back('\\');
                    sink.push_back('t');
                    count += 2;
                    break;
                default:
                    sink.push_back(c);
                    ++count;
                    break;
            }
        }
        return count;
    }